

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis.cpp
# Opt level: O0

SENode * __thiscall
spvtools::opt::ScalarEvolutionAnalysis::GetCachedOrAdd
          (ScalarEvolutionAnalysis *this,
          unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>
          *prospective_node)

{
  bool bVar1;
  reference this_00;
  SENode *raw_ptr_to_node;
  _Node_iterator_base<std::unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>,_true>
  local_28;
  iterator itr;
  unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>
  *prospective_node_local;
  ScalarEvolutionAnalysis *this_local;
  
  itr.
  super__Node_iterator_base<std::unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>,_true>
  ._M_cur = (_Node_iterator_base<std::unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>,_true>
             )(_Node_iterator_base<std::unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>,_true>
               )prospective_node;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_set<std::unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>,_spvtools::opt::SENodeHash,_spvtools::opt::ScalarEvolutionAnalysis::NodePointersEquality,_std::allocator<std::unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>_>_>
       ::find(&this->node_cache_,prospective_node);
  raw_ptr_to_node =
       (SENode *)
       std::
       unordered_set<std::unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>,_spvtools::opt::SENodeHash,_spvtools::opt::ScalarEvolutionAnalysis::NodePointersEquality,_std::allocator<std::unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>_>_>
       ::end(&this->node_cache_);
  bVar1 = std::__detail::operator!=
                    (&local_28,
                     (_Node_iterator_base<std::unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>,_true>
                      *)&raw_ptr_to_node);
  if (bVar1) {
    this_00 = std::__detail::
              _Node_iterator<std::unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>,_true,_true>
              ::operator*((_Node_iterator<std::unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>,_true,_true>
                           *)&local_28);
    this_local = (ScalarEvolutionAnalysis *)
                 std::unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>
                 ::get(this_00);
  }
  else {
    this_local = (ScalarEvolutionAnalysis *)
                 std::unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>
                 ::get(prospective_node);
    std::
    unordered_set<std::unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>,_spvtools::opt::SENodeHash,_spvtools::opt::ScalarEvolutionAnalysis::NodePointersEquality,_std::allocator<std::unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>_>_>
    ::insert(&this->node_cache_,prospective_node);
  }
  return (SENode *)this_local;
}

Assistant:

SENode* ScalarEvolutionAnalysis::GetCachedOrAdd(
    std::unique_ptr<SENode> prospective_node) {
  auto itr = node_cache_.find(prospective_node);
  if (itr != node_cache_.end()) {
    return (*itr).get();
  }

  SENode* raw_ptr_to_node = prospective_node.get();
  node_cache_.insert(std::move(prospective_node));
  return raw_ptr_to_node;
}